

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLHcode curl_easy_header(CURL *easy,char *name,size_t nameindex,uint type,int request,
                          curl_header **hout)

{
  Curl_llist *list;
  char *pcVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  Curl_llist_node *n;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  CURLHcode CVar9;
  Curl_llist_node *local_60;
  
  CVar9 = CURLHE_BAD_ARGUMENT;
  if ((((-2 < request) && (0xffffffe0 < type - 0x20)) && (easy != (CURL *)0x0)) &&
     ((name != (char *)0x0 && (hout != (curl_header **)0x0)))) {
    list = &(easy->state).httphdrs;
    sVar5 = Curl_llist_count(list);
    if (sVar5 == 0) {
      CVar9 = CURLHE_NOHEADERS;
    }
    else {
      iVar2 = (easy->state).requests;
      if (iVar2 < request) {
        CVar9 = CURLHE_NOREQUEST;
      }
      else {
        if (request != -1) {
          iVar2 = request;
        }
        n = Curl_llist_head(list);
        local_60 = (Curl_llist_node *)0x0;
        uVar8 = 0;
        pvVar7 = (void *)0x0;
        for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
          pvVar6 = Curl_node_elem(n);
          iVar3 = curl_strequal(*(char **)((long)pvVar6 + 0x20),name);
          if (((iVar3 != 0) && ((*(byte *)((long)pvVar6 + 0x34) & type) != 0)) &&
             (*(int *)((long)pvVar6 + 0x30) == iVar2)) {
            uVar8 = uVar8 + 1;
            pvVar7 = pvVar6;
            local_60 = n;
          }
        }
        CVar9 = CURLHE_MISSING;
        if (uVar8 != 0) {
          if (nameindex < uVar8) {
            if (uVar8 - 1 == nameindex) {
              uVar4 = (uint)*(byte *)((long)pvVar7 + 0x34);
LAB_0012d60b:
              pcVar1 = *(char **)((long)pvVar7 + 0x28);
              (easy->state).headerout[0].name = *(char **)((long)pvVar7 + 0x20);
              (easy->state).headerout[0].value = pcVar1;
              (easy->state).headerout[0].amount = uVar8;
              (easy->state).headerout[0].index = nameindex;
              (easy->state).headerout[0].origin = uVar4 | 0x8000000;
              (easy->state).headerout[0].anchor = local_60;
              *hout = (easy->state).headerout;
              CVar9 = CURLHE_OK;
            }
            else {
              local_60 = Curl_llist_head(list);
              sVar5 = 0;
              for (; local_60 != (Curl_llist_node *)0x0; local_60 = Curl_node_next(local_60)) {
                pvVar7 = Curl_node_elem(local_60);
                iVar3 = curl_strequal(*(char **)((long)pvVar7 + 0x20),name);
                if (((iVar3 != 0) &&
                    (uVar4 = (uint)*(byte *)((long)pvVar7 + 0x34), (uVar4 & type) != 0)) &&
                   (*(int *)((long)pvVar7 + 0x30) == iVar2)) {
                  if (sVar5 == nameindex) goto LAB_0012d60b;
                  sVar5 = sVar5 + 1;
                }
              }
            }
          }
          else {
            CVar9 = CURLHE_BADINDEX;
          }
        }
      }
    }
  }
  return CVar9;
}

Assistant:

CURLHcode curl_easy_header(CURL *easy,
                           const char *name,
                           size_t nameindex,
                           unsigned int type,
                           int request,
                           struct curl_header **hout)
{
  struct Curl_llist_node *e;
  struct Curl_llist_node *e_pick = NULL;
  struct Curl_easy *data = easy;
  size_t match = 0;
  size_t amount = 0;
  struct Curl_header_store *hs = NULL;
  struct Curl_header_store *pick = NULL;
  if(!name || !hout || !data ||
     (type > (CURLH_HEADER|CURLH_TRAILER|CURLH_CONNECT|CURLH_1XX|
              CURLH_PSEUDO)) || !type || (request < -1))
    return CURLHE_BAD_ARGUMENT;
  if(!Curl_llist_count(&data->state.httphdrs))
    return CURLHE_NOHEADERS; /* no headers available */
  if(request > data->state.requests)
    return CURLHE_NOREQUEST;
  if(request == -1)
    request = data->state.requests;

  /* we need a first round to count amount of this header */
  for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
    hs = Curl_node_elem(e);
    if(strcasecompare(hs->name, name) &&
       (hs->type & type) &&
       (hs->request == request)) {
      amount++;
      pick = hs;
      e_pick = e;
    }
  }
  if(!amount)
    return CURLHE_MISSING;
  else if(nameindex >= amount)
    return CURLHE_BADINDEX;

  if(nameindex == amount - 1)
    /* if the last or only occurrence is what's asked for, then we know it */
    hs = pick;
  else {
    for(e = Curl_llist_head(&data->state.httphdrs); e; e = Curl_node_next(e)) {
      hs = Curl_node_elem(e);
      if(strcasecompare(hs->name, name) &&
         (hs->type & type) &&
         (hs->request == request) &&
         (match++ == nameindex)) {
        e_pick = e;
        break;
      }
    }
    if(!e) /* this should not happen */
      return CURLHE_MISSING;
  }
  /* this is the name we want */
  copy_header_external(hs, nameindex, amount, e_pick,
                       &data->state.headerout[0]);
  *hout = &data->state.headerout[0];
  return CURLHE_OK;
}